

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

bool __thiscall Assimp::AMFImporter::XML_ReadNode_GetAttrVal_AsBool(AMFImporter *this,int pAttrIdx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DeadlyImportError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_58;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string val;
  int pAttrIdx_local;
  AMFImporter *this_local;
  
  val.field_2._12_4_ = pAttrIdx;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)(uint)pAttrIdx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,(char *)CONCAT44(extraout_var,iVar2),&local_41);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"false");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"0");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"true");
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"1");
        if (!bVar1) {
          this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::operator+(&local_98,
                         "Bool attribute value can contain \"false\"/\"0\" or \"true\"/\"1\" not the \""
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40);
          std::operator+(&local_78,&local_98,"\"");
          DeadlyImportError::DeadlyImportError(this_00,&local_78);
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
      }
      this_local._7_1_ = true;
      goto LAB_00577c42;
    }
  }
  this_local._7_1_ = false;
LAB_00577c42:
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool AMFImporter::XML_ReadNode_GetAttrVal_AsBool(const int pAttrIdx)
{
    std::string val(mReader->getAttributeValue(pAttrIdx));

	if((val == "false") || (val == "0"))
		return false;
	else if((val == "true") || (val == "1"))
		return true;
	else
		throw DeadlyImportError("Bool attribute value can contain \"false\"/\"0\" or \"true\"/\"1\" not the \"" + val + "\"");
}